

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O1

DdNode * cuddBddExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  DdNode *f_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *f_01;
  DdNode *pDVar5;
  
  pDVar3 = manager->one;
  pDVar5 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (pDVar3 == pDVar5 || pDVar3 == cube) {
    return f;
  }
  while (manager->perm[cube->index] < manager->perm[pDVar5->index]) {
    cube = (cube->type).kids.T;
    if (cube == pDVar3) {
      return f;
    }
  }
  if ((pDVar5->ref != 1) &&
     (pDVar2 = cuddCacheLookup2(manager,Cudd_bddExistAbstract,f,cube), pDVar2 != (DdNode *)0x0)) {
    return pDVar2;
  }
  pDVar2 = (pDVar5->type).kids.T;
  pDVar4 = (pDVar5->type).kids.E;
  f_01 = (DdNode *)((ulong)pDVar4 ^ 1);
  f_00 = (DdNode *)((ulong)pDVar2 ^ 1);
  if (pDVar5 == f) {
    f_01 = pDVar4;
    f_00 = pDVar2;
  }
  if (pDVar5->index == cube->index) {
    if (f_00 == pDVar3) {
      return pDVar3;
    }
    if (f_01 == pDVar3) {
      return pDVar3;
    }
    if (f_00 == (DdNode *)((ulong)f_01 ^ 1)) {
      return pDVar3;
    }
    pDVar2 = cuddBddExistAbstractRecur(manager,f_00,(cube->type).kids.T);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    if (pDVar2 == pDVar3) {
      if (pDVar5->ref != 1) {
        cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,pDVar3);
        return pDVar3;
      }
      return pDVar3;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = cuddBddExistAbstractRecur(manager,f_01,(cube->type).kids.T);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar2 ^ 1),(DdNode *)((ulong)pDVar3 ^ 1));
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(manager,pDVar2);
        Cudd_IterDerefBdd(manager,pDVar3);
        if (pDVar5->ref != 1) {
          cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,(DdNode *)((ulong)pDVar4 ^ 1));
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return (DdNode *)((ulong)pDVar4 ^ 1);
      }
      Cudd_IterDerefBdd(manager,pDVar2);
      pDVar2 = pDVar3;
    }
  }
  else {
    pDVar2 = cuddBddExistAbstractRecur(manager,f_00,cube);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = cuddBddExistAbstractRecur(manager,f_01,cube);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddBddIteRecur(manager,manager->vars[pDVar5->index],pDVar2,pDVar3);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(manager,pDVar2);
        Cudd_IterDerefBdd(manager,pDVar3);
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        if (pDVar5->ref != 1) {
          cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,pDVar4);
          return pDVar4;
        }
        return pDVar4;
      }
      Cudd_IterDerefBdd(manager,pDVar2);
      pDVar2 = pDVar3;
    }
  }
  Cudd_IterDerefBdd(manager,pDVar2);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *F, *T, *E, *res, *res1, *res2, *one;

    statLine(manager);
    one = DD_ONE(manager);
    F = Cudd_Regular(f);

    /* Cube is guaranteed to be a cube at this point. */        
    if (cube == one || F == one) {  
        return(f);
    }
    /* From now on, f and cube are non-constant. */

    /* Abstract a variable that does not appear in f. */
    while (manager->perm[F->index] > manager->perm[cube->index]) {
        cube = cuddT(cube);
        if (cube == one) return(f);
    }

    /* Check the cache. */
    if (F->ref != 1 && (res = cuddCacheLookup2(manager, Cudd_bddExistAbstract, f, cube)) != NULL) {
        return(res);
    }

    /* Compute the cofactors of f. */
    T = cuddT(F); E = cuddE(F);
    if (f != F) {
        T = Cudd_Not(T); E = Cudd_Not(E);
    }

    /* If the two indices are the same, so are their levels. */
    if (F->index == cube->index) {
        if (T == one || E == one || T == Cudd_Not(E)) {
            return(one);
        }
        res1 = cuddBddExistAbstractRecur(manager, T, cuddT(cube));
        if (res1 == NULL) return(NULL);
        if (res1 == one) {
            if (F->ref != 1)
                cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, one);
            return(one);
        }
        cuddRef(res1);
        res2 = cuddBddExistAbstractRecur(manager, E, cuddT(cube));
        if (res2 == NULL) {
            Cudd_IterDerefBdd(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = cuddBddAndRecur(manager, Cudd_Not(res1), Cudd_Not(res2));
        if (res == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            Cudd_IterDerefBdd(manager, res2);
            return(NULL);
        }
        res = Cudd_Not(res);
        cuddRef(res);
        Cudd_IterDerefBdd(manager, res1);
        Cudd_IterDerefBdd(manager, res2);
        if (F->ref != 1)
            cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, res);
        cuddDeref(res);
        return(res);
    } else { /* if (cuddI(manager,F->index) < cuddI(manager,cube->index)) */
        res1 = cuddBddExistAbstractRecur(manager, T, cube);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddBddExistAbstractRecur(manager, E, cube);
        if (res2 == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            return(NULL);
        }
        cuddRef(res2);
        /* ITE takes care of possible complementation of res1 and of the
        ** case in which res1 == res2. */
        res = cuddBddIteRecur(manager, manager->vars[F->index], res1, res2);
        if (res == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            Cudd_IterDerefBdd(manager, res2);
            return(NULL);
        }
        cuddRef(res); //Added
        Cudd_IterDerefBdd(manager, res1); //cuddDeref(res1);
        Cudd_IterDerefBdd(manager, res2); //cuddDeref(res2);
        cuddDeref(res); //Added
        if (F->ref != 1)
            cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, res);
        return(res);
    }       

}